

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_io.cpp
# Opt level: O3

bool __thiscall ON_BrepTrimArray::Read(ON_BrepTrimArray *this,ON_BinaryArchive *file)

{
  bool bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ON_BrepTrim *pOVar5;
  int iVar6;
  int count;
  int major_version;
  int minor_version;
  ON__UINT32 tcode;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK;
  ON__INT32 local_48;
  int local_44 [3];
  ON__INT64 local_38;
  
  ON_ClassArray<ON_BrepTrim>::Empty((ON_ClassArray<ON_BrepTrim> *)this);
  bVar3 = false;
  local_44[2] = 0;
  local_38 = 0;
  local_48 = 0;
  local_44[0] = 0;
  local_44[1] = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmBigChunk(file,(uint *)(local_44 + 2),&local_38);
  if (bVar1) {
    if (local_44[2] == 0x40008000) {
      bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,local_44,local_44 + 1);
      bVar2 = 0;
      if ((bVar1) && (bVar2 = 0, local_44[0] == 1)) {
        bVar2 = ON_BinaryArchive::ReadInt(file,&local_48);
        ON_ClassArray<ON_BrepTrim>::SetCapacity((ON_ClassArray<ON_BrepTrim> *)this,(long)local_48);
        if (((bool)bVar2) && (0 < local_48)) {
          iVar6 = 1;
          do {
            pOVar5 = ON_ClassArray<ON_BrepTrim>::AppendNew((ON_ClassArray<ON_BrepTrim> *)this);
            iVar4 = (*(pOVar5->super_ON_CurveProxy).super_ON_Curve.super_ON_Geometry.super_ON_Object
                      ._vptr_ON_Object[0xb])(pOVar5,file);
            bVar2 = (byte)iVar4;
            if (bVar2 == 0) break;
            if (pOVar5->m_trim_index !=
                (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.m_count +
                -1) {
              ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_brep_io.cpp"
                         ,0x1e3,"","Invalid value of m_trim_index");
              pOVar5->m_trim_index =
                   (this->super_ON_ObjectArray<ON_BrepTrim>).super_ON_ClassArray<ON_BrepTrim>.
                   m_count + -1;
            }
            bVar1 = iVar6 < local_48;
            iVar6 = iVar6 + 1;
          } while ((bVar2 & bVar1) != 0);
        }
      }
    }
    else {
      bVar2 = 0;
    }
    bVar3 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar3 = (bool)(bVar3 & bVar2);
  }
  return bVar3;
}

Assistant:

bool ON_BrepTrimArray::Read( ON_BinaryArchive& file )
{
  Empty();
  ON__UINT32 tcode = 0;
  ON__INT64 length_TCODE_ANONYMOUS_CHUNK = 0;
  int count = 0;
  int i;
  int major_version = 0;
  int minor_version = 0;
  bool rc = file.BeginRead3dmBigChunk( &tcode, &length_TCODE_ANONYMOUS_CHUNK );
  if (rc) {
    if (tcode != TCODE_ANONYMOUS_CHUNK)
      rc = false;
    if (rc) rc = file.Read3dmChunkVersion(&major_version,&minor_version);
    if (rc) {
      if ( major_version==1 ) {
        if (rc) rc = file.ReadInt(&count);
        SetCapacity(count);
        for ( i = 0; i < count && rc ; i++ ) {
          ON_BrepTrim& trim = AppendNew();
          rc = trim.Read(file)?true:false;
          if ( rc )
          {
            if ( trim.m_trim_index != m_count-1 )
            {
              // 28 May 2013 Dale Lear
              //   Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-18299
              //   Fix bogus index values to prevent crashes.
              ON_ERROR("Invalid value of m_trim_index");
              trim.m_trim_index = m_count-1;
            }
          }
        }    
      }
      else {
        rc = 0;
      }
    }
    if ( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}